

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_maxelements
                 (lysp_ctx *ctx,lysp_stmt *stmt,uint32_t *max,uint16_t *flags,
                 lysp_ext_instance **exts)

{
  int iVar1;
  LY_ERR LVar2;
  size_t sVar3;
  ushort **ppuVar4;
  int *piVar5;
  ulonglong uVar6;
  char *pcVar7;
  ly_ctx *local_90;
  ly_ctx *local_88;
  ly_ctx *local_80;
  ly_ctx *local_78;
  ly_ctx *local_70;
  lysp_stmt *plStack_60;
  LY_ERR ret___1;
  lysp_stmt *child;
  LY_ERR ret__;
  unsigned_long_long num;
  char *ptr;
  lysp_ext_instance **pplStack_38;
  int arg_len;
  lysp_ext_instance **exts_local;
  uint16_t *flags_local;
  uint32_t *max_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  pplStack_38 = exts;
  exts_local = (lysp_ext_instance **)flags;
  flags_local = (uint16_t *)max;
  max_local = (uint32_t *)stmt;
  stmt_local = (lysp_stmt *)ctx;
  if ((*flags & 0x400) == 0) {
    *flags = *flags | 0x400;
    ctx_local._4_4_ = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
    if (ctx_local._4_4_ == LY_SUCCESS) {
      sVar3 = strlen(*(char **)(max_local + 2));
      ptr._4_4_ = (uint)sVar3;
      if (((ptr._4_4_ == 0) || (**(char **)(max_local + 2) == '0')) ||
         ((**(char **)(max_local + 2) != 'u' &&
          (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)**(char **)(max_local + 2)] & 0x800) == 0))))
      {
        if (stmt_local == (lysp_stmt *)0x0) {
          local_78 = (ly_ctx *)0x0;
        }
        else {
          local_78 = *(ly_ctx **)
                      **(undefined8 **)
                        (*(long *)(stmt_local[1].stmt + 8) +
                        (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
        }
        ly_vlog(local_78,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                (ulong)ptr._4_4_,*(undefined8 *)(max_local + 2),"max-elements");
        ctx_local._4_4_ = LY_EVALID;
      }
      else {
        if ((ptr._4_4_ == 9) &&
           (iVar1 = strncmp(*(char **)(max_local + 2),"unbounded",9), iVar1 == 0)) {
          flags_local[0] = 0;
          flags_local[1] = 0;
        }
        else {
          piVar5 = __errno_location();
          *piVar5 = 0;
          uVar6 = strtoull(*(char **)(max_local + 2),(char **)&num,10);
          if (num - *(long *)(max_local + 2) != (long)(int)ptr._4_4_) {
            if (stmt_local == (lysp_stmt *)0x0) {
              local_80 = (ly_ctx *)0x0;
            }
            else {
              local_80 = *(ly_ctx **)
                          **(undefined8 **)
                            (*(long *)(stmt_local[1].stmt + 8) +
                            (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
            }
            ly_vlog(local_80,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                    (ulong)ptr._4_4_,*(undefined8 *)(max_local + 2),"max-elements");
            return LY_EVALID;
          }
          piVar5 = __errno_location();
          if ((*piVar5 == 0x22) || (0xffffffff < uVar6)) {
            if (stmt_local == (lysp_stmt *)0x0) {
              local_88 = (ly_ctx *)0x0;
            }
            else {
              local_88 = *(ly_ctx **)
                          **(undefined8 **)
                            (*(long *)(stmt_local[1].stmt + 8) +
                            (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
            }
            ly_vlog(local_88,(char *)0x0,LYVE_SYNTAX_YANG,"Value \"%.*s\" is out of \"%s\" bounds.",
                    (ulong)ptr._4_4_,*(undefined8 *)(max_local + 2),"max-elements");
            return LY_EVALID;
          }
          *(int *)flags_local = (int)uVar6;
        }
        for (plStack_60 = *(lysp_stmt **)(max_local + 10); plStack_60 != (lysp_stmt *)0x0;
            plStack_60 = plStack_60->next) {
          if (plStack_60->kw != LY_STMT_EXTENSION_INSTANCE) {
            if (stmt_local == (lysp_stmt *)0x0) {
              local_90 = (ly_ctx *)0x0;
            }
            else {
              local_90 = *(ly_ctx **)
                          **(undefined8 **)
                            (*(long *)(stmt_local[1].stmt + 8) +
                            (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
            }
            pcVar7 = lyplg_ext_stmt2str(plStack_60->kw);
            ly_vlog(local_90,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar7,"max-elements");
            return LY_EVALID;
          }
          LVar2 = lysp_stmt_ext((lysp_ctx *)stmt_local,plStack_60,LY_STMT_MAX_ELEMENTS,0,pplStack_38
                               );
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
        }
        ctx_local._4_4_ = LY_SUCCESS;
      }
    }
  }
  else {
    if (ctx == (lysp_ctx *)0x0) {
      local_70 = (ly_ctx *)0x0;
    }
    else {
      local_70 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(local_70,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","max-elements");
    ctx_local._4_4_ = LY_EVALID;
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_maxelements(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, uint32_t *max, uint16_t *flags,
        struct lysp_ext_instance **exts)
{
    int arg_len;
    char *ptr;
    unsigned long long num;

    if (*flags & LYS_SET_MAX) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "max-elements");
        return LY_EVALID;
    }
    *flags |= LYS_SET_MAX;

    /* get value */
    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));
    arg_len = strlen(stmt->arg);

    if (!arg_len || (stmt->arg[0] == '0') || ((stmt->arg[0] != 'u') && !isdigit(stmt->arg[0]))) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, "max-elements");
        return LY_EVALID;
    }

    if ((arg_len != ly_strlen_const("unbounded")) || strncmp(stmt->arg, "unbounded", arg_len)) {
        errno = 0;
        num = strtoull(stmt->arg, &ptr, LY_BASE_DEC);
        /* we have not parsed the whole argument */
        if (ptr - stmt->arg != arg_len) {
            LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, "max-elements");
            return LY_EVALID;
        }
        if ((errno == ERANGE) || (num > UINT32_MAX)) {
            LOGVAL_PARSER(ctx, LY_VCODE_OOB, arg_len, stmt->arg, "max-elements");
            return LY_EVALID;
        }

        *max = num;
    } else {
        /* unbounded */
        *max = 0;
    }

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_MAX_ELEMENTS, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "max-elements");
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}